

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>,Eigen::Matrix<float,3,1,0,3,1>,1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_4,_1,_0,_4,_1> *dst,
               Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>
               *src,assign_op<float,_float> *func)

{
  Index func_00;
  Matrix<float,_4,_1,_0,_4,_1> *dstExpr;
  undefined1 local_b0 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_78 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>
  *src_local;
  Matrix<float,_4,_1,_0,_4,_1> *dst_local;
  
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_innerDim = (Index)func;
  evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>
  ::evaluator((evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>
               *)local_78,src);
  resize_if_allowed<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>,Eigen::Matrix<float,3,1,0,3,1>,1>,float,float>
            (dst,src,(assign_op<float,_float> *)
                     srcEvaluator.
                     super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                     .m_innerDim);
  evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
            .m_innerDim;
  dstExpr = EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_b0,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_78,
             (assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_2,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_b0);
  evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>
  ::~evaluator((evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>
                *)local_78);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}